

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromiseresolver.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseResolver<QByteArray>::reject<std::__exception_ptr::exception_ptr>
          (PromiseResolver<QByteArray> *this,exception_ptr *error)

{
  QPromise<QByteArray> *pQVar1;
  Data *pDVar2;
  PromiseData<QByteArray> *pPVar3;
  QPromise<QByteArray> *promise;
  exception_ptr *error_local;
  PromiseResolver<QByteArray> *this_local;
  
  pDVar2 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QByteArray>::Data>::
           operator->(&this->m_d);
  pQVar1 = pDVar2->promise;
  if (pQVar1 != (QPromise<QByteArray> *)0x0) {
    pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QByteArray>_>::operator->
                       (&(pQVar1->super_QPromiseBase<QByteArray>).m_d);
    PromiseDataBase<QByteArray,_void_(const_QByteArray_&)>::
    reject<std::__exception_ptr::exception_ptr>
              (&pPVar3->super_PromiseDataBase<QByteArray,_void_(const_QByteArray_&)>,error);
    pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QByteArray>_>::operator->
                       (&(pQVar1->super_QPromiseBase<QByteArray>).m_d);
    PromiseDataBase<QByteArray,_void_(const_QByteArray_&)>::dispatch
              (&pPVar3->super_PromiseDataBase<QByteArray,_void_(const_QByteArray_&)>);
    release(this);
  }
  return;
}

Assistant:

void reject(E&& error)
    {
        auto promise = m_d->promise;
        if (promise) {
            Q_ASSERT(promise->isPending());
            promise->m_d->reject(std::forward<E>(error));
            promise->m_d->dispatch();
            release();
        }
    }